

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferAndTextureContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numTextures,int texWid,
          int texHei)

{
  vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *this_01;
  undefined8 vtxShaderSource_;
  int i;
  undefined8 *puVar3;
  long *plVar4;
  mapped_type *pmVar5;
  long lVar6;
  size_type *psVar7;
  ulong *puVar8;
  long *plVar9;
  ulong uVar10;
  float fVar11;
  string vtxTexCoordOutputs;
  string fragTexCoordInputs;
  string vtxTexCoordWrites;
  ProgramContext *context;
  string fragColorExpression;
  string fragSamplers;
  string vtxTexCoordInputs;
  ostringstream s;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  firstLevelParams;
  key_type local_470;
  long *local_450;
  undefined8 local_448;
  long local_440;
  undefined8 uStack_438;
  ulong *local_430;
  long local_428;
  ulong local_420;
  long lStack_418;
  string local_410;
  float local_3ec;
  ulong *local_3e8;
  long local_3e0;
  ulong local_3d8;
  long lStack_3d0;
  string local_3c8;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  string local_388;
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  ProgramContext *local_348;
  undefined1 *local_340;
  long local_338;
  undefined1 local_330;
  undefined7 uStack_32f;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *local_320;
  float local_314;
  int local_310;
  int local_30c;
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8 [2];
  string local_2c8;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298;
  undefined7 uStack_297;
  VarSpec local_288;
  undefined1 local_1e0 [376];
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fVar11 = 0.0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_288.name._M_dataplus._M_p = (pointer)&local_288.name.field_2;
  local_288.name._M_string_length = 0;
  local_288.name.field_2._M_local_buf[0] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410._M_string_length = 0;
  local_410.field_2._M_allocated_capacity =
       local_410.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  local_3c8._M_string_length = 0;
  local_3c8.field_2._M_local_buf[0] = '\0';
  local_2a8 = &local_298;
  local_2a0 = 0;
  local_298 = 0;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_470.field_2;
  local_3ec = (float)numTextures;
  local_348 = __return_storage_ptr__;
  local_320 = (vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *)this;
  local_310 = texWid;
  local_30c = texHei;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numTextures) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((ostringstream *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,0x1ceae61);
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_440 = *plVar4;
        uStack_438 = puVar3[3];
        local_450 = &local_440;
      }
      else {
        local_440 = *plVar4;
        local_450 = (long *)*puVar3;
      }
      local_448 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470.field_2._8_8_ = plVar4[3];
        local_470._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_470._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_470._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar1) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_450 != &local_440) {
        operator_delete(local_450,local_440 + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((ostringstream *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,0x1ceae83);
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_440 = *plVar4;
        uStack_438 = puVar3[3];
        local_450 = &local_440;
      }
      else {
        local_440 = *plVar4;
        local_450 = (long *)*puVar3;
      }
      local_448 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470.field_2._8_8_ = plVar4[3];
        local_470._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_470._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_470._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar1) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_450 != &local_440) {
        operator_delete(local_450,local_440 + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((ostringstream *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,0x1ceaea6);
      local_3e8 = &local_3d8;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_3d8 = *puVar8;
        lStack_3d0 = plVar4[3];
      }
      else {
        local_3d8 = *puVar8;
        local_3e8 = (ulong *)*plVar4;
      }
      local_3e0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_3e8);
      local_3a8 = &local_398;
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_398 = *plVar9;
        lStack_390 = plVar4[3];
      }
      else {
        local_398 = *plVar9;
        local_3a8 = (long *)*plVar4;
      }
      local_3a0 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a8);
      local_430 = &local_420;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_420 = *puVar8;
        lStack_418 = plVar4[3];
      }
      else {
        local_420 = *puVar8;
        local_430 = (ulong *)*plVar4;
      }
      local_428 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((ostringstream *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      uVar10 = 0xf;
      if (local_430 != &local_420) {
        uVar10 = local_420;
      }
      if (uVar10 < (ulong)(local_338 + local_428)) {
        uVar10 = 0xf;
        if (local_340 != &local_330) {
          uVar10 = CONCAT71(uStack_32f,local_330);
        }
        if (uVar10 < (ulong)(local_338 + local_428)) goto LAB_01840996;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,(ulong)local_430);
      }
      else {
LAB_01840996:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_340);
      }
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_440 = *plVar4;
        uStack_438 = puVar3[3];
        local_450 = &local_440;
      }
      else {
        local_440 = *plVar4;
        local_450 = (long *)*puVar3;
      }
      local_448 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470.field_2._8_8_ = plVar4[3];
        local_470._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_470._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_470._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar1) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_450 != &local_440) {
        operator_delete(local_450,local_440 + 1);
      }
      if (local_340 != &local_330) {
        operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398 + 1);
      }
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368,local_358 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((ostringstream *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,0x1ceaeb2);
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_440 = *plVar4;
        uStack_438 = puVar3[3];
        local_450 = &local_440;
      }
      else {
        local_440 = *plVar4;
        local_450 = (long *)*puVar3;
      }
      local_448 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470.field_2._8_8_ = plVar4[3];
        local_470._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_470._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_470._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar1) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_450 != &local_440) {
        operator_delete(local_450,local_440 + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((ostringstream *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,0x1ceaed5);
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_440 = *plVar4;
        uStack_438 = puVar3[3];
        local_450 = &local_440;
      }
      else {
        local_440 = *plVar4;
        local_450 = (long *)*puVar3;
      }
      local_448 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470.field_2._8_8_ = plVar4[3];
        local_470._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_470._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_470._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar1) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_450 != &local_440) {
        operator_delete(local_450,local_440 + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      local_340 = &local_330;
      local_338 = 0;
      local_330 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_340);
      local_368 = &local_358;
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_358 = *plVar9;
        lStack_350 = plVar4[3];
      }
      else {
        local_358 = *plVar9;
        local_368 = (long *)*plVar4;
      }
      local_360 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_368);
      local_3e8 = &local_3d8;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_3d8 = *puVar8;
        lStack_3d0 = plVar4[3];
      }
      else {
        local_3d8 = *puVar8;
        local_3e8 = (ulong *)*plVar4;
      }
      local_3e0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((ostringstream *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      uVar10 = 0xf;
      if (local_3e8 != &local_3d8) {
        uVar10 = local_3d8;
      }
      if (uVar10 < (ulong)(local_2e0 + local_3e0)) {
        uVar10 = 0xf;
        if (local_2e8 != local_2d8) {
          uVar10 = local_2d8[0];
        }
        if (uVar10 < (ulong)(local_2e0 + local_3e0)) goto LAB_01840f88;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_3e8);
      }
      else {
LAB_01840f88:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_2e8);
      }
      local_3a8 = &local_398;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_398 = *plVar4;
        lStack_390 = puVar3[3];
      }
      else {
        local_398 = *plVar4;
        local_3a8 = (long *)*puVar3;
      }
      local_3a0 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a8);
      local_430 = &local_420;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_420 = *puVar8;
        lStack_418 = plVar4[3];
      }
      else {
        local_420 = *puVar8;
        local_430 = (ulong *)*plVar4;
      }
      local_428 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((ostringstream *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      uVar10 = 0xf;
      if (local_430 != &local_420) {
        uVar10 = local_420;
      }
      if (uVar10 < (ulong)(local_300 + local_428)) {
        uVar10 = 0xf;
        if (local_308 != local_2f8) {
          uVar10 = local_2f8[0];
        }
        if (uVar10 < (ulong)(local_300 + local_428)) goto LAB_018410f8;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_430);
      }
      else {
LAB_018410f8:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_308);
      }
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_440 = *plVar4;
        uStack_438 = puVar3[3];
        local_450 = &local_440;
      }
      else {
        local_440 = *plVar4;
        local_450 = (long *)*puVar3;
      }
      local_448 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_450);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470.field_2._8_8_ = plVar4[3];
        local_470._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar7;
        local_470._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_470._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_470._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar1) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_450 != &local_440) {
        operator_delete(local_450,local_440 + 1);
      }
      if (local_308 != local_2f8) {
        operator_delete(local_308,local_2f8[0] + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398 + 1);
      }
      if (local_2e8 != local_2d8) {
        operator_delete(local_2e8,local_2d8[0] + 1);
      }
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368,local_358 + 1);
      }
      if (local_340 != &local_330) {
        operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
      }
      fVar11 = (float)((int)fVar11 + 1);
    } while (local_3ec != fVar11);
  }
  this_01 = local_320;
  substitute((string *)local_1e0,(ProgramLibrary *)local_320,&local_288.name);
  local_470._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"VTX_TEX_COORD_INPUTS","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,&local_470);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar1) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_1e0 + 0x10;
  if ((char *)local_1e0._0_8_ != pcVar2) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  substitute((string *)local_1e0,(ProgramLibrary *)this_01,&local_410);
  local_470._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"VTX_TEX_COORD_OUTPUTS","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,&local_470);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar1) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_1e0._0_8_ != pcVar2) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  local_1e0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"VTX_TEX_COORD_WRITES","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)local_1e0);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((char *)local_1e0._0_8_ != pcVar2) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  substitute((string *)local_1e0,(ProgramLibrary *)this_01,&local_3c8);
  local_470._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"FRAG_TEX_COORD_INPUTS","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,&local_470);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar1) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_1e0._0_8_ != pcVar2) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  local_1e0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"FRAG_SAMPLERS","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)local_1e0);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((char *)local_1e0._0_8_ != pcVar2) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  substitute((string *)local_1e0,(ProgramLibrary *)this_01,&local_2c8);
  local_470._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"FRAG_COLOR_EXPRESSION","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,&local_470);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar1) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_1e0._0_8_ != pcVar2) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                             local_2c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,
                    CONCAT71(local_3c8.field_2._M_allocated_capacity._1_7_,
                             local_3c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.name._M_dataplus._M_p != &local_288.name.field_2) {
    operator_delete(local_288.name._M_dataplus._M_p,
                    CONCAT71(local_288.name.field_2._M_allocated_capacity._1_7_,
                             local_288.name.field_2._M_local_buf[0]) + 1);
  }
  local_288.name._M_dataplus._M_p = (pointer)&local_288.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_TEX_COORD_INPUTS}${VTX_TEX_COORD_OUTPUTS}\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n${VTX_TEX_COORD_WRITES}}\n"
             ,"");
  substitute((string *)local_1e0,(ProgramLibrary *)this_01,&local_288.name,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60);
  vtxShaderSource_ = local_1e0._0_8_;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,
             "${FRAG_HEADER}${FRAG_TEX_COORD_INPUTS}${FRAG_SAMPLERS}\nvoid main (void)\n{\n\t${FRAG_COLOR} =${FRAG_COLOR_EXPRESSION};\n}\n"
             ,"");
  substitute(&local_410,(ProgramLibrary *)this_01,&local_388,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60);
  ProgramContext::ProgramContext
            (local_348,(char *)vtxShaderSource_,local_410._M_dataplus._M_p,"a_position");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  if ((char *)local_1e0._0_8_ != pcVar2) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.name._M_dataplus._M_p != &local_288.name.field_2) {
    operator_delete(local_288.name._M_dataplus._M_p,
                    CONCAT71(local_288.name.field_2._M_allocated_capacity._1_7_,
                             local_288.name.field_2._M_local_buf[0]) + 1);
  }
  local_288.name._M_dataplus._M_p = (pointer)&local_288.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"a_position","");
  local_320 = &local_348->attributes;
  lVar6 = 0;
  do {
    *(undefined4 *)((long)&local_410._M_dataplus._M_p + lVar6 * 4) = 0xbdcccccd;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    *(undefined4 *)((long)&local_388._M_dataplus._M_p + lVar6 * 4) = 0x3dcccccd;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1e0,&local_288.name,(Vector<float,_3> *)&local_410,
             (Vector<float,_3> *)&local_388);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(local_320,(VarSpec *)local_1e0);
  if ((char *)local_1e0._0_8_ != pcVar2) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.name._M_dataplus._M_p != &local_288.name.field_2) {
    operator_delete(local_288.name._M_dataplus._M_p,
                    CONCAT71(local_288.name.field_2._M_allocated_capacity._1_7_,
                             local_288.name.field_2._M_local_buf[0]) + 1);
  }
  if (0 < (int)local_3ec) {
    local_68 = &local_348->uniforms;
    local_314 = 1.0 / (float)(int)local_3ec;
    this_00 = &local_348->textureSpecs;
    fVar11 = 0.0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((TextureSpec *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,0x1ceae78);
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_410.field_2._M_allocated_capacity = *psVar7;
        local_410.field_2._8_8_ = plVar4[3];
      }
      else {
        local_410.field_2._M_allocated_capacity = *psVar7;
        local_410._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_410._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_1e0._0_8_ = (pointer)0x0;
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&local_3c8._M_dataplus._M_p + lVar6 * 4) = 0x3f800000;
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      VarSpec::VarSpec<tcu::Vector<float,2>>
                (&local_288,&local_410,(Vector<float,_2> *)local_1e0,(Vector<float,_2> *)&local_3c8)
      ;
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
      emplace_back<deqp::gls::VarSpec>(local_320,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.name._M_dataplus._M_p != &local_288.name.field_2) {
        operator_delete(local_288.name._M_dataplus._M_p,
                        CONCAT71(local_288.name.field_2._M_allocated_capacity._1_7_,
                                 local_288.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,
                        CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                                 local_388.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::ostream::operator<<((TextureSpec *)local_1e0,(int)fVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,0x1c24c42);
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_410.field_2._M_allocated_capacity = *puVar8;
        local_410.field_2._8_8_ = plVar4[3];
      }
      else {
        local_410.field_2._M_allocated_capacity = *puVar8;
        local_410._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_410._M_string_length = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_288.name._M_dataplus._M_p = (pointer)&local_288.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_410._M_dataplus._M_p,
                 local_410._M_dataplus._M_p + local_410._M_string_length);
      local_288.type = TYPE_INT;
      local_288.minValue.i[0] = (int)fVar11;
      local_288.maxValue._0_4_ = fVar11;
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
      emplace_back<deqp::gls::VarSpec>(local_68,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.name._M_dataplus._M_p != &local_288.name.field_2) {
        operator_delete(local_288.name._M_dataplus._M_p,
                        CONCAT71(local_288.name.field_2._M_allocated_capacity._1_7_,
                                 local_288.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,
                        CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                                 local_388.field_2._M_local_buf[0]) + 1);
      }
      lVar6 = 0;
      do {
        *(float *)((long)&local_288.name._M_dataplus._M_p + lVar6 * 4) = local_314;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      local_1e0._0_8_ = (ulong)(uint)fVar11 << 0x20;
      local_1e0._8_4_ = local_310;
      local_1e0._12_4_ = local_30c;
      local_1e0._16_8_ = 0x140100001908;
      local_1e0._24_4_ = 0x1908;
      local_1e0[0x1c] = '\x01';
      local_1e0._32_8_ = 0x260100002703;
      local_1e0._40_8_ = 0x290100002901;
      local_1e0._48_8_ = 0;
      local_1e0._56_8_ = 0;
      local_1e0._64_8_ = local_288.name._M_dataplus._M_p;
      local_1e0._72_8_ = local_288.name._M_string_length;
      std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
      emplace_back<deqp::gls::TextureSpec>(this_00,(TextureSpec *)local_1e0);
      fVar11 = (float)((int)fVar11 + 1);
    } while (fVar11 != local_3ec);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return local_348;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateBufferAndTextureContext (const int numTextures, const int texWid, const int texHei) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_TEX_COORD_INPUTS}"
		"${VTX_TEX_COORD_OUTPUTS}"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 1.0);\n"
		"${VTX_TEX_COORD_WRITES}"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_TEX_COORD_INPUTS}"
		"${FRAG_SAMPLERS}"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} =${FRAG_COLOR_EXPRESSION};\n"
		"}\n";

	map<string, string> firstLevelParams;

	{
		string vtxTexCoordInputs;
		string vtxTexCoordOutputs;
		string vtxTexCoordWrites;
		string fragTexCoordInputs;
		string fragSamplers;
		string fragColorExpression;

		for (int i = 0; i < numTextures; i++)
		{
			vtxTexCoordInputs		+= "${VTX_IN} mediump vec2 a_texCoord" + toString(i) + ";\n";
			vtxTexCoordOutputs		+= "${VTX_OUT} mediump vec2 v_texCoord" + toString(i) + ";\n";
			vtxTexCoordWrites		+= "\tv_texCoord" + toString(i) + " = " + "a_texCoord" + toString(i) + ";\n";
			fragTexCoordInputs		+= "${FRAG_IN} mediump vec2 v_texCoord" + toString(i) + ";\n";
			fragSamplers			+= "uniform mediump sampler2D u_sampler" + toString(i) + ";\n";
			fragColorExpression		+= string() + (i > 0 ? " +" : "") + "\n\t\t${TEXTURE_2D_FUNC}(u_sampler" + toString(i) + ", v_texCoord" + toString(i) + ")";
		}

		firstLevelParams["VTX_TEX_COORD_INPUTS"]	= substitute(vtxTexCoordInputs);
		firstLevelParams["VTX_TEX_COORD_OUTPUTS"]	= substitute(vtxTexCoordOutputs);
		firstLevelParams["VTX_TEX_COORD_WRITES"]	= vtxTexCoordWrites;
		firstLevelParams["FRAG_TEX_COORD_INPUTS"]	= substitute(fragTexCoordInputs);
		firstLevelParams["FRAG_SAMPLERS"]			= fragSamplers;
		firstLevelParams["FRAG_COLOR_EXPRESSION"]	= substitute(fragColorExpression);
	}

	gls::ProgramContext context(substitute(vertexTemplate, firstLevelParams).c_str(), substitute(fragmentTemplate, firstLevelParams).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position", Vec3(-0.1f), Vec3(0.1f)));

	for (int i = 0; i < numTextures; i++)
	{
		context.attributes.push_back(gls::VarSpec("a_texCoord" + de::toString(i), Vec2(0.0f), Vec2(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_sampler" + de::toString(i), i));
		context.textureSpecs.push_back(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, i,
														texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA, true,
														GL_LINEAR_MIPMAP_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
														Vec4(0.0f), Vec4(1.0f / (float)numTextures)));
	}

	return context;
}